

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_NV_PUBLIC_Unmarshal(TPMS_NV_PUBLIC *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  TVar3 = TPMI_RH_NV_INDEX_Unmarshal(&target->nvIndex,buffer,size);
  if (TVar3 == 0) {
    iVar1 = *size;
    *size = iVar1 + -2;
    TVar3 = 0x9a;
    if (1 < iVar1) {
      UVar2 = ByteArrayToUint16(*buffer);
      target->nameAlg = UVar2;
      *buffer = *buffer + 2;
      TVar3 = 0x83;
      if ((UVar2 < 0xe) && ((0x3810U >> (UVar2 & 0x1f) & 1) != 0)) {
        TVar3 = TPMA_NV_Unmarshal(&target->attributes,buffer,size);
        if (TVar3 == 0) {
          TVar3 = TPM2B_DIGEST_Unmarshal(&target->authPolicy,buffer,size);
          if (TVar3 == 0) {
            iVar1 = *size;
            *size = iVar1 + -2;
            TVar3 = 0x9a;
            if (1 < iVar1) {
              UVar2 = ByteArrayToUint16(*buffer);
              target->dataSize = UVar2;
              *buffer = *buffer + 2;
              TVar3 = 0x95;
              if (UVar2 < 0x801) {
                TVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMS_NV_PUBLIC_Unmarshal(TPMS_NV_PUBLIC *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMI_RH_NV_INDEX_Unmarshal((TPMI_RH_NV_INDEX *)&(target->nvIndex), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&(target->nameAlg), buffer, size, 0);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_NV_Unmarshal((TPMA_NV *)&(target->attributes), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->authPolicy), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT16_Unmarshal((UINT16 *)&(target->dataSize), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( (target->dataSize> MAX_NV_INDEX_SIZE))
        return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}